

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDefinition.cpp
# Opt level: O3

bool __thiscall
Rml::PropertyDefinition::ParseValue(PropertyDefinition *this,Property *property,String *value)

{
  long *plVar1;
  char cVar2;
  bool bVar3;
  pointer pPVar4;
  long lVar5;
  ulong uVar6;
  
  pPVar4 = (this->parsers).
           super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = 0x28;
  if ((this->parsers).
      super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
      ._M_impl.super__Vector_impl_data._M_finish == pPVar4) {
    uVar6 = 0;
    bVar3 = false;
  }
  else {
    lVar5 = 8;
    uVar6 = 0;
    do {
      plVar1 = *(long **)((long)pPVar4 + lVar5 + -8);
      cVar2 = (**(code **)(*plVar1 + 0x10))(plVar1,property,value,(long)&pPVar4->parser + lVar5);
      if (cVar2 != '\0') {
        property->definition = this;
        bVar3 = true;
        lVar5 = 0x38;
        goto LAB_0024b5b2;
      }
      uVar6 = uVar6 + 1;
      pPVar4 = (this->parsers).
               super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x38;
    } while (uVar6 < (ulong)(((long)(this->parsers).
                                    super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3)
                            * 0x6db6db6db6db6db7));
    uVar6 = 0;
    bVar3 = false;
    lVar5 = 0x28;
  }
LAB_0024b5b2:
  *(int *)((property->value).data + lVar5 + -8) = (int)uVar6;
  return bVar3;
}

Assistant:

bool PropertyDefinition::ParseValue(Property& property, const String& value) const
{
	for (size_t i = 0; i < parsers.size(); i++)
	{
		if (parsers[i].parser->ParseValue(property, value, parsers[i].parameters))
		{
			property.definition = this;
			property.parser_index = (int)i;
			return true;
		}
	}

	property.unit = Unit::UNKNOWN;
	return false;
}